

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O3

void __thiscall cmSearchPath::AddCMakePath(cmSearchPath *this,string *variable)

{
  char *pcVar1;
  size_t sVar2;
  string *path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string local_38;
  
  if (this->FC == (cmFindCommon *)0x0) {
    __assert_fail("this->FC != CM_NULLPTR",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmSearchPath.cxx"
                  ,0x50,"void cmSearchPath::AddCMakePath(const std::string &)");
  }
  pcVar1 = cmMakefile::GetDefinition((this->FC->super_cmCommand).Makefile,variable);
  if (pcVar1 != (char *)0x0) {
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    sVar2 = strlen(pcVar1);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar1,pcVar1 + sVar2);
    cmSystemTools::ExpandListArgument(&local_38,&local_58,false);
    path = local_58.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      path = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; path != local_58.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; path = path + 1) {
      pcVar1 = cmMakefile::GetCurrentSourceDirectory((this->FC->super_cmCommand).Makefile);
      AddPathInternal(this,path,pcVar1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
  }
  return;
}

Assistant:

void cmSearchPath::AddCMakePath(const std::string& variable)
{
  assert(this->FC != CM_NULLPTR);

  // Get a path from a CMake variable.
  if (const char* value = this->FC->Makefile->GetDefinition(variable)) {
    std::vector<std::string> expanded;
    cmSystemTools::ExpandListArgument(value, expanded);

    for (std::vector<std::string>::const_iterator p = expanded.begin();
         p != expanded.end(); ++p) {
      this->AddPathInternal(*p,
                            this->FC->Makefile->GetCurrentSourceDirectory());
    }
  }
}